

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O0

bool __thiscall HighsIis::trivial(HighsIis *this,HighsLp *lp,HighsOptions *options)

{
  double dVar1;
  const_reference pvVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  long in_RDX;
  int *in_RSI;
  undefined1 *in_RDI;
  HighsInt iRow_1;
  HighsInt iEl;
  HighsInt iCol_1;
  vector<int,_std::allocator<int>_> count;
  HighsInt num_iis_row;
  HighsInt num_iis_col;
  HighsInt iRow;
  HighsInt iCol;
  HighsInt k;
  bool col_priority;
  HighsInt in_stack_ffffffffffffff58;
  HighsInt in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  int local_70;
  int local_6c;
  int local_68;
  vector<int,_std::allocator<int>_> local_50;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  byte local_21;
  long local_20;
  int *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  invalidate((HighsIis *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_21 = *(int *)(local_20 + 0x200) == 1;
  for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
    if ((((local_21 & 1) == 0) || (local_28 != 0)) && (((local_21 & 1) != 0 || (local_28 != 1)))) {
      for (local_30 = 0; local_30 < local_18[1]; local_30 = local_30 + 1) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),
                            (long)local_30);
        in_stack_ffffffffffffff70 = (vector<int,_std::allocator<int>_> *)*pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),
                            (long)local_30);
        if (*(double *)(local_20 + 0x118) * 2.0 < (double)in_stack_ffffffffffffff70 - *pvVar2) {
          addRow((HighsIis *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
          break;
        }
      }
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
    }
    else {
      for (local_2c = 0; local_2c < *local_18; local_2c = local_2c + 1) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 8),(long)local_2c
                           );
        dVar1 = *pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),
                            (long)local_2c);
        if (*(double *)(local_20 + 0x118) * 2.0 < dVar1 - *pvVar2) {
          addCol((HighsIis *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
          break;
        }
      }
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 8));
    }
    if (sVar3 != 0) break;
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 8));
  local_34 = (int)sVar3;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
  local_38 = (int)sVar3;
  if (local_34 + local_38 < 1) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4ce0dc);
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (value_type_conflict2 *)0x4ce0ff);
    for (local_68 = 0; local_68 < *local_18; local_68 = local_68 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),(long)local_68);
      local_6c = *pvVar4;
      while (in_stack_ffffffffffffff64 = local_6c,
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),
                                (long)(local_68 + 1)), in_stack_ffffffffffffff64 < *pvVar4) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0x30),(long)local_6c);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)*pvVar4);
        *pvVar5 = *pvVar5 + 1;
        local_6c = local_6c + 1;
      }
    }
    for (local_70 = 0; local_70 < local_18[1]; local_70 = local_70 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)local_70);
      if (*pvVar5 < 1) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),
                            (long)local_70);
        if (*pvVar2 < *(double *)(local_20 + 0x118) || *pvVar2 == *(double *)(local_20 + 0x118)) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),
                              (long)local_70);
          if (*pvVar2 < -*(double *)(local_20 + 0x118)) {
            addRow((HighsIis *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
          }
        }
        else {
          addRow((HighsIis *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
        }
        sVar3 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
        if (sVar3 != 0) {
          *in_RDI = 1;
          *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(local_20 + 0x200);
          local_1 = 1;
          goto LAB_004ce31c;
        }
      }
    }
    local_1 = 0;
LAB_004ce31c:
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff70);
  }
  else {
    *in_RDI = 1;
    *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(local_20 + 0x200);
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool HighsIis::trivial(const HighsLp& lp, const HighsOptions& options) {
  this->invalidate();
  const bool col_priority =
      //      options.iis_strategy == kIisStrategyFromRayColPriority ||
      options.iis_strategy == kIisStrategyFromLpColPriority;
  for (HighsInt k = 0; k < 2; k++) {
    if ((col_priority && k == 0) || (!col_priority && k == 1)) {
      // Loop over columns first
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        if (lp.col_lower_[iCol] - lp.col_upper_[iCol] >
            2 * options.primal_feasibility_tolerance) {
          this->addCol(iCol, kIisBoundStatusBoxed);
          break;
        }
      }
      if (this->col_index_.size() > 0) break;
    } else {
      // Loop over rows first
      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        if (lp.row_lower_[iRow] - lp.row_upper_[iRow] >
            2 * options.primal_feasibility_tolerance) {
          this->addRow(iRow, kIisBoundStatusBoxed);
          break;
        }
      }
      if (this->row_index_.size() > 0) break;
    }
  }
  HighsInt num_iis_col = this->col_index_.size();
  HighsInt num_iis_row = this->row_index_.size();
  // If one is found then we're done
  if (num_iis_col + num_iis_row > 0) {
    // Should have found exactly 1
    assert((num_iis_col == 1 || num_iis_row == 1) &&
           num_iis_col + num_iis_row < 2);
    this->valid_ = true;
    this->strategy_ = options.iis_strategy;
    return true;
  }
  // Now look for empty rows that cannot have zero activity
  std::vector<HighsInt> count;
  count.assign(lp.num_row_, 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++)
      count[lp.a_matrix_.index_[iEl]]++;
  }
  assert(this->row_index_.size() == 0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (count[iRow] > 0) continue;
    if (lp.row_lower_[iRow] > options.primal_feasibility_tolerance) {
      this->addRow(iRow, kIisBoundStatusLower);
    } else if (lp.row_upper_[iRow] < -options.primal_feasibility_tolerance) {
      this->addRow(iRow, kIisBoundStatusUpper);
    }
    if (this->row_index_.size() > 0) {
      this->valid_ = true;
      this->strategy_ = options.iis_strategy;
      return true;
    }
  }
  return false;
}